

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O0

double calc_output_single(SINC_FILTER *filter,increment_t increment,increment_t start_filter_index)

{
  increment_t iVar1;
  int iVar2;
  double dVar3;
  int steps;
  int indx;
  int coeff_count;
  int data_index;
  increment_t max_filter_index;
  increment_t filter_index;
  double icoeff;
  double right;
  double left;
  double fraction;
  increment_t start_filter_index_local;
  increment_t increment_local;
  SINC_FILTER *filter_local;
  
  iVar1 = int_to_fp(filter->coeff_half_len);
  iVar2 = (iVar1 - start_filter_index) / increment;
  data_index = start_filter_index + iVar2 * increment;
  indx = filter->b_current - iVar2;
  if (indx < 0) {
    iVar2 = int_div_ceil(data_index,increment);
    if (iVar2 < -indx) {
      __assert_fail("steps <= int_div_ceil (filter_index, increment)",
                    "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                    ,0x184,"double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
    }
    data_index = data_index - increment * -indx;
    indx = 0;
  }
  right = 0.0;
  while( true ) {
    if (data_index < 0) {
      iVar2 = (iVar1 - (increment - start_filter_index)) / increment;
      data_index = (increment - start_filter_index) + iVar2 * increment;
      indx = filter->b_current + 1 + iVar2;
      icoeff = 0.0;
      do {
        dVar3 = fp_to_double(data_index);
        iVar2 = fp_to_int(data_index);
        if (filter->coeff_half_len + 2 <= iVar2) {
          __assert_fail("indx < filter->coeff_half_len + 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                        ,0x1a0,"double calc_output_single(SINC_FILTER *, increment_t, increment_t)")
          ;
        }
        if ((indx < 0) || (filter->b_len <= indx)) {
          __assert_fail("data_index >= 0 && data_index < filter->b_len",
                        "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                        ,0x1a2,"double calc_output_single(SINC_FILTER *, increment_t, increment_t)")
          ;
        }
        if (filter->b_end <= indx) {
          __assert_fail("data_index < filter->b_end",
                        "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                        ,0x1a3,"double calc_output_single(SINC_FILTER *, increment_t, increment_t)")
          ;
        }
        icoeff = (dVar3 * (double)(filter->coeffs[iVar2 + 1] - filter->coeffs[iVar2]) +
                 (double)filter->coeffs[iVar2]) * (double)filter->buffer[indx] + icoeff;
        data_index = data_index - increment;
        indx = indx + -1;
      } while (0 < data_index);
      return right + icoeff;
    }
    dVar3 = fp_to_double(data_index);
    iVar2 = fp_to_int(data_index);
    if ((iVar2 < 0) || (filter->coeff_half_len + 2 <= iVar2 + 1)) {
      __assert_fail("indx >= 0 && indx + 1 < filter->coeff_half_len + 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                    ,0x18c,"double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
    }
    if ((indx < 0) || (filter->b_len <= indx)) break;
    if (filter->b_end <= indx) {
      __assert_fail("data_index < filter->b_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                    ,399,"double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
    }
    right = (dVar3 * (double)(filter->coeffs[iVar2 + 1] - filter->coeffs[iVar2]) +
            (double)filter->coeffs[iVar2]) * (double)filter->buffer[indx] + right;
    data_index = data_index - increment;
    indx = indx + 1;
  }
  __assert_fail("data_index >= 0 && data_index < filter->b_len",
                "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_sinc.c"
                ,0x18e,"double calc_output_single(SINC_FILTER *, increment_t, increment_t)");
}

Assistant:

static inline double
calc_output_single (SINC_FILTER *filter, increment_t increment, increment_t start_filter_index)
{	double		fraction, left, right, icoeff ;
	increment_t	filter_index, max_filter_index ;
	int			data_index, coeff_count, indx ;

	/* Convert input parameters into fixed point. */
	max_filter_index = int_to_fp (filter->coeff_half_len) ;

	/* First apply the left half of the filter. */
	filter_index = start_filter_index ;
	coeff_count = (max_filter_index - filter_index) / increment ;
	filter_index = filter_index + coeff_count * increment ;
	data_index = filter->b_current - coeff_count ;

	if (data_index < 0) /* Avoid underflow access to filter->buffer. */
	{	int steps = -data_index ;
		/* If the assert triggers we would have to take care not to underflow/overflow */
		assert (steps <= int_div_ceil (filter_index, increment)) ;
		filter_index -= increment * steps ;
		data_index += steps ;
	}
	left = 0.0 ;
	while (filter_index >= MAKE_INCREMENT_T (0))
	{	fraction = fp_to_double (filter_index) ;
		indx = fp_to_int (filter_index) ;
		assert (indx >= 0 && indx + 1 < filter->coeff_half_len + 2) ;
		icoeff = filter->coeffs [indx] + fraction * (filter->coeffs [indx + 1] - filter->coeffs [indx]) ;
		assert (data_index >= 0 && data_index < filter->b_len) ;
		assert (data_index < filter->b_end) ;
		left += icoeff * filter->buffer [data_index] ;

		filter_index -= increment ;
		data_index = data_index + 1 ;
		} ;

	/* Now apply the right half of the filter. */
	filter_index = increment - start_filter_index ;
	coeff_count = (max_filter_index - filter_index) / increment ;
	filter_index = filter_index + coeff_count * increment ;
	data_index = filter->b_current + 1 + coeff_count ;

	right = 0.0 ;
	do
	{	fraction = fp_to_double (filter_index) ;
		indx = fp_to_int (filter_index) ;
		assert (indx < filter->coeff_half_len + 2) ;
		icoeff = filter->coeffs [indx] + fraction * (filter->coeffs [indx + 1] - filter->coeffs [indx]) ;
		assert (data_index >= 0 && data_index < filter->b_len) ;
		assert (data_index < filter->b_end) ;
		right += icoeff * filter->buffer [data_index] ;

		filter_index -= increment ;
		data_index = data_index - 1 ;
		}
	while (filter_index > MAKE_INCREMENT_T (0)) ;

	return (left + right) ;
}